

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

BTLeafNode * __thiscall storage::BTLeafNode::split(BTLeafNode *this,int key,Record *record)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  BTLeafNode *pBVar5;
  Record **ppRVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  Record *pRVar16;
  bool bVar17;
  ulong uVar6;
  
  pBVar5 = (BTLeafNode *)operator_new(0x278);
  (pBVar5->super_BTNode).parent_ = (BTNode *)0x0;
  (pBVar5->super_BTNode).child_index_ = -1;
  (pBVar5->super_BTNode).used_links_count_ = 0;
  (pBVar5->super_BTNode)._vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109d70;
  memset(pBVar5->record_links_,0,0x198);
  pBVar5->next_ = this->next_;
  this->next_ = pBVar5;
  iVar9 = (this->super_BTNode).used_links_count_;
  uVar8 = iVar9 / 2;
  uVar3 = iVar9 - uVar8;
  uVar6 = (ulong)uVar3;
  uVar12 = uVar8;
  if (1 < iVar9) {
    uVar4 = iVar9 - 2;
    bVar17 = false;
    uVar14 = uVar6;
    uVar11 = uVar8;
    uVar1 = iVar9 - 1;
    do {
      iVar10 = (this->super_BTNode).keys_[uVar4];
      pRVar16 = this->record_links_[uVar4];
      uVar15 = uVar4;
      if ((iVar10 < key) && (!bVar17)) {
        bVar17 = true;
        pRVar16 = record;
        iVar10 = key;
        uVar15 = uVar1;
      }
      if ((int)uVar14 < 1) {
        uVar12 = uVar11 - 1;
        (this->super_BTNode).keys_[(long)(int)uVar11 + -1] = iVar10;
        ppRVar7 = this->record_links_ + (long)(int)uVar11 + -1;
      }
      else {
        uVar14 = (ulong)((int)uVar14 - 1);
        (pBVar5->super_BTNode).keys_[uVar14] = iVar10;
        ppRVar7 = pBVar5->record_links_ + uVar14;
        uVar12 = uVar11;
      }
      *ppRVar7 = pRVar16;
      uVar4 = uVar15 - 1;
      uVar11 = uVar12;
      uVar1 = uVar15;
    } while (0 < (int)uVar15);
  }
  if (0 < (int)uVar12) {
    (this->super_BTNode).keys_[uVar12 - 1] = key;
    this->record_links_[uVar12 - 1] = record;
  }
  (pBVar5->super_BTNode).parent_ = (this->super_BTNode).parent_;
  (this->super_BTNode).used_links_count_ = uVar8 + 1;
  (pBVar5->super_BTNode).used_links_count_ = uVar3 + 1;
  bVar17 = iVar9 < 4;
  if (3 < iVar9) {
    iVar9 = (this->super_BTNode).keys_[1];
    if (iVar9 <= (this->super_BTNode).keys_[0]) goto LAB_00105fed;
    lVar2 = 0;
    do {
      lVar13 = lVar2;
      if ((ulong)uVar8 - 2 == lVar13) break;
      iVar10 = (this->super_BTNode).keys_[lVar13 + 2];
      bVar17 = iVar9 < iVar10;
      lVar2 = lVar13 + 1;
      iVar9 = iVar10;
    } while (bVar17);
    bVar17 = (ulong)uVar8 <= lVar13 + 2U;
  }
  if (!bVar17) {
LAB_00105fed:
    __assert_fail("cc(this->keys_, this->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x1c7,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
  }
  bVar17 = (int)uVar3 < 2;
  if (1 < (int)uVar3) {
    iVar9 = (pBVar5->super_BTNode).keys_[1];
    if (iVar9 <= (pBVar5->super_BTNode).keys_[0]) goto LAB_0010600c;
    lVar2 = 0;
    do {
      lVar13 = lVar2;
      if (uVar6 - 2 == lVar13) break;
      iVar10 = (pBVar5->super_BTNode).keys_[lVar13 + 2];
      bVar17 = iVar9 < iVar10;
      lVar2 = lVar13 + 1;
      iVar9 = iVar10;
    } while (bVar17);
    bVar17 = uVar6 <= lVar13 + 2U;
  }
  if (bVar17) {
    return pBVar5;
  }
LAB_0010600c:
  __assert_fail("cc(M->keys_, M->key_count())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                ,0x1c8,"BTLeafNode *storage::BTLeafNode::split(int, Record *)");
}

Assistant:

BTLeafNode *BTLeafNode::split(int key, Record *record) {
        BTLeafNode *M = new BTLeafNode;
        M->next_ = this->next_;
        this->next_ = M;
        int SN = (key_count() + 1) / 2;
        int SM = (key_count() + 1) - SN;

        int SN1 = SN, SM1 = SM;

        bool flag = false;  // first
        for (int i = key_count() - 1; i >= 0; --i) {
            int k = keys_[i];
            Record *r = record_links_[i];
            if (keys_[i] < key && !flag) {
                i++;
                k = key;
                r = record;
                flag = true;
            }
            if (SM > 0) {
                M->keys_[SM - 1] = k;
                M->record_links_[SM - 1] = r;
                SM--;
            } else {
                keys_[SN - 1] = k;
                record_links_[SN - 1] = r;
                SN--;
            }
        }
        if (SN > 0) {
            keys_[SN - 1] = key;
            record_links_[SN - 1] = record;
        }
        M->parent_ = parent_;
        this->used_links_count_ = 1 + SN1;
        M->used_links_count_ = 1 + SM1;

        assert(cc(this->keys_, this->key_count()));
        assert(cc(M->keys_, M->key_count()));

        return M;
    }